

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float,duckdb::QuantileListOperation<float,true>>
               (float *idata,AggregateInputData *aggr_input_data,
               QuantileState<float,_duckdb::QuantileStandardType> **states,ValidityMask *mask,
               idx_t count)

{
  unsigned_long *puVar1;
  QuantileState<float,_duckdb::QuantileStandardType> *pQVar2;
  iterator iVar3;
  ulong uVar4;
  idx_t iVar5;
  unsigned_long uVar6;
  ulong uVar7;
  ulong uVar8;
  float local_64;
  float local_60;
  float local_5c;
  ulong local_58;
  QuantileState<float,_duckdb::QuantileStandardType> **local_50;
  idx_t local_48;
  ValidityMask *local_40;
  ulong local_38;
  
  local_40 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar5 = 0;
      do {
        pQVar2 = states[iVar5];
        local_5c = idata[iVar5];
        iVar3._M_current =
             (((_Vector_base<float,_std::allocator<float>_> *)&pQVar2->v)->_M_impl).
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (((_Vector_base<float,_std::allocator<float>_> *)&pQVar2->v)->_M_impl).
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    ((vector<float,_std::allocator<float>_> *)pQVar2,iVar3,&local_5c);
        }
        else {
          *iVar3._M_current = local_5c;
          (((_Vector_base<float,_std::allocator<float>_> *)&pQVar2->v)->_M_impl).
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_58 = count + 0x3f >> 6;
    local_38 = 0;
    uVar7 = 0;
    local_50 = states;
    local_48 = count;
    do {
      puVar1 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = 0xffffffffffffffff;
      }
      else {
        uVar6 = puVar1[local_38];
      }
      uVar4 = uVar7 + 0x40;
      if (count <= uVar7 + 0x40) {
        uVar4 = count;
      }
      uVar8 = uVar4;
      if (uVar6 != 0) {
        uVar8 = uVar7;
        if (uVar6 == 0xffffffffffffffff) {
          if (uVar7 < uVar4) {
            do {
              pQVar2 = states[uVar7];
              local_64 = idata[uVar7];
              iVar3._M_current =
                   (((_Vector_base<float,_std::allocator<float>_> *)&pQVar2->v)->_M_impl).
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (((_Vector_base<float,_std::allocator<float>_> *)&pQVar2->v)->_M_impl).
                  super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          ((vector<float,_std::allocator<float>_> *)pQVar2,iVar3,&local_64);
              }
              else {
                *iVar3._M_current = local_64;
                (((_Vector_base<float,_std::allocator<float>_> *)&pQVar2->v)->_M_impl).
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              uVar7 = uVar7 + 1;
              uVar8 = uVar7;
            } while (uVar4 != uVar7);
          }
        }
        else if (uVar7 < uVar4) {
          uVar8 = 0;
          do {
            if ((uVar6 >> (uVar8 & 0x3f) & 1) != 0) {
              pQVar2 = states[uVar7 + uVar8];
              local_60 = idata[uVar7 + uVar8];
              iVar3._M_current =
                   (((_Vector_base<float,_std::allocator<float>_> *)&pQVar2->v)->_M_impl).
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (((_Vector_base<float,_std::allocator<float>_> *)&pQVar2->v)->_M_impl).
                  super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          ((vector<float,_std::allocator<float>_> *)pQVar2,iVar3,&local_60);
              }
              else {
                *iVar3._M_current = local_60;
                (((_Vector_base<float,_std::allocator<float>_> *)&pQVar2->v)->_M_impl).
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
            }
            uVar8 = uVar8 + 1;
          } while ((uVar7 - uVar4) + uVar8 != 0);
          uVar8 = uVar7 + uVar8;
          states = local_50;
          count = local_48;
        }
      }
      local_38 = local_38 + 1;
      uVar7 = uVar8;
    } while (local_38 != local_58);
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}